

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O2

TokenKind slang::parsing::LexerFacts::getSystemKeywordKind(string_view text)

{
  char *pcVar1;
  uint uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  byte bVar6;
  bool bVar7;
  byte bVar8;
  uint uVar9;
  uint64_t uVar10;
  ulong uVar11;
  long lVar12;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  uVar10 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                      &systemIdentifierKeywords,&local_40);
  uVar13 = uVar10 >> (systemIdentifierKeywords & 0x3f);
  lVar14 = (uVar10 & 0xff) * 4;
  cVar3 = (&UNK_0043a38c)[lVar14];
  cVar4 = (&UNK_0043a38d)[lVar14];
  cVar5 = (&UNK_0043a38e)[lVar14];
  bVar6 = (&UNK_0043a38f)[lVar14];
  uVar11 = 0;
  do {
    pcVar1 = (char *)(DAT_00600280 + uVar13 * 0x10);
    bVar8 = pcVar1[0xf];
    auVar15[0] = -(*pcVar1 == cVar3);
    auVar15[1] = -(pcVar1[1] == cVar4);
    auVar15[2] = -(pcVar1[2] == cVar5);
    auVar15[3] = -(pcVar1[3] == bVar6);
    auVar15[4] = -(pcVar1[4] == cVar3);
    auVar15[5] = -(pcVar1[5] == cVar4);
    auVar15[6] = -(pcVar1[6] == cVar5);
    auVar15[7] = -(pcVar1[7] == bVar6);
    auVar15[8] = -(pcVar1[8] == cVar3);
    auVar15[9] = -(pcVar1[9] == cVar4);
    auVar15[10] = -(pcVar1[10] == cVar5);
    auVar15[0xb] = -(pcVar1[0xb] == bVar6);
    auVar15[0xc] = -(pcVar1[0xc] == cVar3);
    auVar15[0xd] = -(pcVar1[0xd] == cVar4);
    auVar15[0xe] = -(pcVar1[0xe] == cVar5);
    auVar15[0xf] = -(bVar8 == bVar6);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
    if (uVar9 != 0) {
      lVar12 = DAT_00600280 + uVar13 * 0x10;
      lVar14 = DAT_00600288 + uVar13 * 0x168;
      do {
        uVar2 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)((ulong)uVar2 * 0x18 + lVar14);
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           &systemIdentifierKeywords,&local_40,__y);
        if (bVar7) {
          return (TokenKind)__y[1]._M_len;
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
      bVar8 = *(byte *)(lVar12 + 0xf);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bVar8) == 0) {
      return Unknown;
    }
    lVar14 = uVar13 + uVar11;
    uVar11 = uVar11 + 1;
    uVar13 = lVar14 + 1U & DAT_00600278;
  } while (uVar11 <= DAT_00600278);
  return Unknown;
}

Assistant:

TokenKind LexerFacts::getSystemKeywordKind(std::string_view text) {
    if (auto it = systemIdentifierKeywords.find(text); it != systemIdentifierKeywords.end())
        return it->second;
    return TokenKind::Unknown;
}